

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

float __thiscall Json::Value::asFloat(Value *this)

{
  runtime_error *this_00;
  double *in_RDI;
  float local_3c;
  float local_34;
  float local_4;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0:
    local_4 = 0.0;
    break;
  case 1:
    local_4 = (float)(long)*in_RDI;
    break;
  case 2:
    local_34 = (float)(ulong)*in_RDI;
    local_4 = local_34;
    break;
  case 3:
    local_4 = (float)*in_RDI;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Value is not convertible to float.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    local_3c = 1.0;
    if (((ulong)*in_RDI & 1) == 0) {
      local_3c = 0.0;
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

float Value::asFloat() const {
  switch (type_) {
  case intValue:
    return static_cast<float>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<float>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return integerToDouble(value_.uint_);
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return static_cast<float>(value_.real_);
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0f : 0.0f;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to float.");
}